

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::InputFile::initialize(InputFile *this)

{
  InputPartData *pIVar1;
  element_type *peVar2;
  _Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
  _Var3;
  _Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
  _Var4;
  exr_storage_t eVar5;
  TiledInputFile *this_00;
  ScanLineInputFile *this_01;
  DeepScanLineInputFile *this_02;
  ostream *poVar6;
  char *pcVar7;
  ArgExc *this_03;
  int partidx;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  pIVar1 = ((this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->_part;
  if (pIVar1 == (InputPartData *)0x0) {
    partidx = 0;
  }
  else {
    partidx = pIVar1->partNumber;
  }
  eVar5 = Context::storage(&this->_ctxt,partidx);
  peVar2 = (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2->_storage = eVar5;
  switch(eVar5) {
  case EXR_STORAGE_SCANLINE:
    this_01 = (ScanLineInputFile *)operator_new(0x20);
    ScanLineInputFile::ScanLineInputFile(this_01,peVar2->_part);
    std::
    __uniq_ptr_impl<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>::
    reset((__uniq_ptr_impl<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
           *)&peVar2->_sFile,this_01);
    return;
  case EXR_STORAGE_TILED:
  case EXR_STORAGE_DEEP_TILED:
    this_00 = (TiledInputFile *)operator_new(0x20);
    TiledInputFile::TiledInputFile(this_00,peVar2->_part);
    std::__uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>::
    reset((__uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_> *
          )&peVar2->_tFile,this_00);
    return;
  case EXR_STORAGE_DEEP_SCANLINE:
    this_02 = (DeepScanLineInputFile *)operator_new(0x20);
    DeepScanLineInputFile::DeepScanLineInputFile(this_02,peVar2->_part);
    std::
    __uniq_ptr_impl<Imf_3_4::DeepScanLineInputFile,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
    ::reset((__uniq_ptr_impl<Imf_3_4::DeepScanLineInputFile,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
             *)&peVar2->_dsFile,this_02);
    std::make_unique<Imf_3_4::CompositeDeepScanLine>();
    _Var4.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl =
         (_Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>)
         (_Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>)__iex_throw_s;
    peVar2 = (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    __iex_throw_s = (CompositeDeepScanLine *)0x0;
    _Var3.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl =
         (peVar2->_compositor)._M_t.
         super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
         ._M_t.
         super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
         .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>;
    (peVar2->_compositor)._M_t.
    super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
    ._M_t.
    super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
    .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false> =
         _Var4.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl;
    if ((_Var3.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl !=
         (CompositeDeepScanLine *)0x0) &&
       ((**(code **)(*(long *)_Var3.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>.
                              _M_head_impl + 8))(), __iex_throw_s != (CompositeDeepScanLine *)0x0))
    {
      (**(code **)(*(long *)__iex_throw_s + 8))();
    }
    break;
  default:
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar6 = std::operator<<(local_190,"Unable to handle data storage type in file \'");
    pcVar7 = Context::fileName(&this->_ctxt);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,"\'");
    this_03 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_03,(stringstream *)&_iex_throw_s);
    __cxa_throw(this_03,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  peVar2 = (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  CompositeDeepScanLine::addSource
            ((CompositeDeepScanLine *)
             (peVar2->_compositor)._M_t.
             super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
             ._M_t.
             super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
             .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>,
             (DeepScanLineInputFile *)
             (peVar2->_dsFile)._M_t.
             super___uniq_ptr_impl<Imf_3_4::DeepScanLineInputFile,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
             ._M_t.
             super__Tuple_impl<0UL,_Imf_3_4::DeepScanLineInputFile_*,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
             .super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>);
  return;
}

Assistant:

void
InputFile::initialize (void)
{
    int partidx;

    partidx = _data->getPartIdx ();
    _data->_storage = _ctxt.storage (partidx);

    // silly protection rules mean make_unique can't be used here
    if (_data->_storage == EXR_STORAGE_DEEP_SCANLINE)
    {
        _data->_dsFile.reset (new DeepScanLineInputFile (_data->_part));
        _data->_compositor = std::make_unique<CompositeDeepScanLine> ();
        _data->_compositor->addSource (_data->_dsFile.get ());
    }
    else if (
        _data->_storage == EXR_STORAGE_DEEP_TILED ||
        _data->_storage == EXR_STORAGE_TILED)
    {
        _data->_tFile.reset (new TiledInputFile (_data->_part));
    }
    else if (_data->_storage == EXR_STORAGE_SCANLINE)
    {
        _data->_sFile.reset (new ScanLineInputFile (_data->_part));
    }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to handle data storage type in file '" << fileName ()
                                                           << "'");
    }
}